

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone_info_source.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::time_internal::cctz::ZoneInfoSource::Version_abi_cxx11_
          (string *__return_storage_ptr__,ZoneInfoSource *this)

{
  ZoneInfoSource *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ZoneInfoSource::Version() const { return std::string(); }